

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::BaseBuilder::onAttach(BaseBuilder *this,CodeHolder *code)

{
  Error EVar1;
  SectionNode *initialSection;
  BaseNode *local_20;
  
  EVar1 = BaseEmitter::onAttach(&this->super_BaseEmitter,code);
  if (EVar1 == 0) {
    EVar1 = sectionNodeOf(this,(SectionNode **)&local_20,0);
    if ((EVar1 == 0) &&
       (EVar1 = 0, (uint)(*(int *)&this->field_0x174 - *(int *)&this->field_0x170) < 8)) {
      EVar1 = ZoneVectorBase::_grow((ZoneVectorBase *)&this->_passes,&this->_allocator,8,8);
    }
    if (EVar1 == 0) {
      this->_cursor = local_20;
      *(BaseNode **)&this->_nodeList = local_20;
      *(BaseNode **)&this->field_0x1a8 = local_20;
      local_20[0x11] = (BaseNode)0x80;
      EVar1 = 0;
    }
    else {
      (*(this->super_BaseEmitter)._vptr_BaseEmitter[0x11])(this,code);
    }
  }
  return EVar1;
}

Assistant:

Error BaseBuilder::onAttach(CodeHolder* code) noexcept {
  ASMJIT_PROPAGATE(Base::onAttach(code));

  SectionNode* initialSection;
  Error err = sectionNodeOf(&initialSection, 0);

  if (!err)
    err = _passes.willGrow(&_allocator, 8);

  if (ASMJIT_UNLIKELY(err)) {
    onDetach(code);
    return err;
  }

  ASMJIT_ASSUME(initialSection != nullptr);
  _cursor = initialSection;
  _nodeList.reset(initialSection, initialSection);
  initialSection->setFlags(NodeFlags::kIsActive);

  return kErrorOk;
}